

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int is_one_pass_rt_params(AV1_COMP *cpi)

{
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((cpi->oxcf).mode == '\x01')) {
    return (int)((cpi->oxcf).gf_cfg.lag_in_frames == 0);
  }
  return 0;
}

Assistant:

static inline int is_one_pass_rt_params(const AV1_COMP *cpi) {
  return has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
         cpi->oxcf.gf_cfg.lag_in_frames == 0;
}